

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::FiberStack::runOne(FiberStack *this)

{
  uint uVar1;
  long lVar2;
  FunctionParam<void_()> *in_RDX;
  Exception *exception;
  NullableValue<kj::Exception> _exception1534;
  Exception local_350;
  Maybe<kj::Exception> local_1c0;
  
  uVar1 = (this->main).tag;
  if (uVar1 == 2) {
    runCatchingExceptions<kj::FunctionParam<void()>&>
              (&local_1c0,*(kj **)(this->main).field_1,in_RDX);
    if (local_1c0.ptr.isSet == true) {
      local_350.ownFile.content.ptr = local_1c0.ptr.field_1.value.ownFile.content.ptr;
      local_350.ownFile.content.size_ = local_1c0.ptr.field_1.value.ownFile.content.size_;
      local_350.ownFile.content.disposer = local_1c0.ptr.field_1.value.ownFile.content.disposer;
      local_1c0.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      local_1c0.ptr.field_1.value.ownFile.content.size_ = 0;
      local_350.file = local_1c0.ptr.field_1.value.file;
      local_350.line = local_1c0.ptr.field_1.value.line;
      local_350.type = local_1c0.ptr.field_1.value.type;
      local_350.description.content.ptr = local_1c0.ptr.field_1.value.description.content.ptr;
      local_350.description.content.size_ = local_1c0.ptr.field_1.value.description.content.size_;
      local_350.description.content.disposer =
           local_1c0.ptr.field_1.value.description.content.disposer;
      local_350.context.ptr.disposer = local_1c0.ptr.field_1.value.context.ptr.disposer;
      local_1c0.ptr.field_1.value.description.content.ptr = (char *)0x0;
      local_1c0.ptr.field_1.value.description.content.size_ = 0;
      local_350.context.ptr.ptr = local_1c0.ptr.field_1.value.context.ptr.ptr;
      local_350.remoteTrace.content.ptr = local_1c0.ptr.field_1.value.remoteTrace.content.ptr;
      local_1c0.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
      local_350.remoteTrace.content.size_ = local_1c0.ptr.field_1.value.remoteTrace.content.size_;
      local_350.remoteTrace.content.disposer =
           local_1c0.ptr.field_1.value.remoteTrace.content.disposer;
      local_1c0.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
      local_1c0.ptr.field_1.value.remoteTrace.content.size_ = 0;
      memcpy(local_350.trace,(void *)((long)&local_1c0.ptr.field_1 + 0x68),0x105);
      local_350.details.builder.ptr = local_1c0.ptr.field_1.value.details.builder.ptr;
      local_350.details.builder.pos = local_1c0.ptr.field_1.value.details.builder.pos;
      local_350.details.builder.endPtr = local_1c0.ptr.field_1.value.details.builder.endPtr;
      local_350.details.builder.disposer = local_1c0.ptr.field_1.value.details.builder.disposer;
      local_1c0.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
      local_1c0.ptr.field_1.value.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
      local_1c0.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
      Exception::~Exception(&local_1c0.ptr.field_1.value);
    }
    if (local_1c0.ptr.isSet == true) {
      lVar2 = *(long *)(this->main).field_1.space;
      if (*(char *)(lVar2 + 8) == '\x01') {
        *(undefined1 *)(lVar2 + 8) = 0;
        Exception::~Exception((Exception *)(lVar2 + 0x10));
      }
      *(char **)(lVar2 + 0x10) = local_350.ownFile.content.ptr;
      *(size_t *)(lVar2 + 0x18) = local_350.ownFile.content.size_;
      *(ArrayDisposer **)(lVar2 + 0x20) = local_350.ownFile.content.disposer;
      local_350.ownFile.content.ptr = (char *)0x0;
      local_350.ownFile.content.size_ = 0;
      *(char **)(lVar2 + 0x28) = local_350.file;
      *(undefined8 *)(lVar2 + 0x30) = local_350._32_8_;
      *(char **)(lVar2 + 0x38) = local_350.description.content.ptr;
      *(size_t *)(lVar2 + 0x40) = local_350.description.content.size_;
      *(ArrayDisposer **)(lVar2 + 0x48) = local_350.description.content.disposer;
      local_350.description.content.ptr = (char *)0x0;
      local_350.description.content.size_ = 0;
      *(Disposer **)(lVar2 + 0x50) = local_350.context.ptr.disposer;
      *(Context **)(lVar2 + 0x58) = local_350.context.ptr.ptr;
      local_350.context.ptr.ptr = (Context *)0x0;
      *(char **)(lVar2 + 0x60) = local_350.remoteTrace.content.ptr;
      *(size_t *)(lVar2 + 0x68) = local_350.remoteTrace.content.size_;
      *(ArrayDisposer **)(lVar2 + 0x70) = local_350.remoteTrace.content.disposer;
      local_350.remoteTrace.content.ptr = (char *)0x0;
      local_350.remoteTrace.content.size_ = 0;
      memcpy((void *)(lVar2 + 0x78),local_350.trace,0x105);
      *(Detail **)(lVar2 + 0x180) = local_350.details.builder.ptr;
      *(RemoveConst<kj::Exception::Detail> **)(lVar2 + 0x188) = local_350.details.builder.pos;
      *(Detail **)(lVar2 + 400) = local_350.details.builder.endPtr;
      *(ArrayDisposer **)(lVar2 + 0x198) = local_350.details.builder.disposer;
      local_350.details.builder.endPtr = (Detail *)0x0;
      local_350.details.builder.ptr = (Detail *)0x0;
      local_350.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
      *(undefined1 *)(lVar2 + 8) = 1;
    }
    if (local_1c0.ptr.isSet == true) {
      Exception::~Exception(&local_350);
    }
  }
  else if (uVar1 == 1) {
    FiberBase::run((FiberBase *)(this->main).field_1);
    return;
  }
  return;
}

Assistant:

void FiberStack::runOne() {
  KJ_SWITCH_ONEOF(main) {
    KJ_CASE_ONEOF(event, FiberBase*) {
      event->run();
    }
    KJ_CASE_ONEOF(func, SynchronousFunc*) {
      KJ_IF_SOME(exception, kj::runCatchingExceptions(func->func)) {
        func->exception.emplace(kj::mv(exception));
      }
    }
  }
}